

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O2

bool amrex::operator==(BATransformer *a,BATransformer *b)

{
  bool bVar1;
  IndexType IVar2;
  IndexType IVar3;
  IntVect IVar4;
  IntVect IVar5;
  
  if (b->m_bat_type == bndryReg || a->m_bat_type == bndryReg) {
    if (a->m_bat_type == bndryReg && b->m_bat_type == bndryReg) {
      bVar1 = operator==(&(a->m_op).m_bndryReg,&(b->m_op).m_bndryReg);
      return bVar1;
    }
  }
  else {
    IVar2 = BATransformer::index_type(a);
    IVar3 = BATransformer::index_type(b);
    if (IVar3.itype == IVar2.itype) {
      IVar4 = BATransformer::coarsen_ratio(a);
      IVar5 = BATransformer::coarsen_ratio(b);
      if (IVar4.vect[0] == IVar5.vect[0]) {
        return IVar4.vect[2] == IVar5.vect[2] && (IVar5.vect._0_8_ ^ IVar4.vect._0_8_) >> 0x20 == 0;
      }
    }
  }
  return false;
}

Assistant:

bool operator== (BATransformer const& a, BATransformer const& b) noexcept {
        if (a.m_bat_type != BATType::bndryReg && b.m_bat_type != BATType::bndryReg) {
            return a.index_type() == b.index_type()
                && a.coarsen_ratio() == b.coarsen_ratio();
        } else if (a.m_bat_type == BATType::bndryReg && b.m_bat_type == BATType::bndryReg) {
            return a.m_op.m_bndryReg == b.m_op.m_bndryReg;
        } else {
            return false;
        }
    }